

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

STRING_HANDLE URL_DecodeString(char *textDecode)

{
  STRING_HANDLE input;
  STRING_HANDLE tempString;
  STRING_HANDLE result;
  char *textDecode_local;
  
  if (textDecode == (char *)0x0) {
    tempString = (STRING_HANDLE)0x0;
  }
  else {
    input = STRING_construct(textDecode);
    if (input == (STRING_HANDLE)0x0) {
      tempString = (STRING_HANDLE)0x0;
    }
    else {
      tempString = URL_Decode(input);
      STRING_delete(input);
    }
  }
  return tempString;
}

Assistant:

STRING_HANDLE URL_DecodeString(const char* textDecode)
{
    STRING_HANDLE result;
    if (textDecode == NULL)
    {
        result = NULL;
    }
    else
    {
        STRING_HANDLE tempString = STRING_construct(textDecode);
        if (tempString == NULL)
        {
            result = NULL;
        }
        else
        {
            result = URL_Decode(tempString);
            STRING_delete(tempString);
        }
    }
    return result;
}